

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition-graph.hxx
# Opt level: O2

void __thiscall
lineage::heuristics::PartitionGraph::
removeVanishedEdges<std::vector<unsigned_long,std::allocator<unsigned_long>>&>
          (PartitionGraph *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *buffer)

{
  size_t *psVar1;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __first;
  bool bVar2;
  __node_base *p_Var3;
  __node_base *p_Var4;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __tmp;
  size_t *psVar5;
  pair<bool,_unsigned_long> pVar6;
  
  std::
  __sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
            ((buffer->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (buffer->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  __first = std::
            __unique<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                      ((buffer->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                       _M_impl.super__Vector_impl_data._M_start,
                       (buffer->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                       _M_impl.super__Vector_impl_data._M_finish);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::erase
            (buffer,(const_iterator)__first._M_current,
             (const_iterator)
             (buffer->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  psVar5 = (buffer->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  do {
    if (psVar5 == (buffer->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start) {
      return;
    }
    psVar1 = psVar5 + -1;
    psVar5 = psVar5 + -1;
    p_Var3 = &(this->partitions_).
              super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start
              [(this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).edges_.
               super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start[*psVar1].vertexIndices_[0]]._M_h.
              _M_before_begin;
    bVar2 = false;
LAB_001452f9:
    p_Var3 = p_Var3->_M_nxt;
    if (p_Var3 != (__node_base *)0x0) {
      p_Var4 = &(this->partitions_).
                super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start
                [(this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).edges_.
                 super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[*psVar5].vertexIndices_[1]]._M_h.
                _M_before_begin;
      do {
        p_Var4 = p_Var4->_M_nxt;
        if (p_Var4 == (__node_base *)0x0) goto LAB_001452f9;
        pVar6 = andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>::findEdge
                          (&this->data_->problemGraph->graph_,(size_t)p_Var3[1]._M_nxt,
                           (size_t)p_Var4[1]._M_nxt);
      } while (((undefined1  [16])pVar6 & (undefined1  [16])0x1) == (undefined1  [16])0x0);
      bVar2 = true;
      goto LAB_001452f9;
    }
    if (!bVar2) {
      removeEdge(this,*psVar5);
    }
  } while( true );
}

Assistant:

void removeVanishedEdges(T&& buffer)
    {
        // Remove duplicates.
        // The second removal would remove an arbitrary other edge!
        std::sort(std::begin(buffer), std::end(buffer));
        auto last = std::unique(std::begin(buffer), std::end(buffer));
        buffer.erase(last, buffer.end());

        for (auto it = buffer.crbegin(); it != buffer.crend(); ++it) {

            bool exists = false;
            for (const auto& a : partitions_[this->vertexOfEdge(*it, 0)]) {
                for (const auto& b : partitions_[this->vertexOfEdge(*it, 1)]) {
                    if (this->data_.problemGraph.graph().findEdge(a, b).first) {
                        exists = true;
                        break;
                    }
                }
            }

            if (!exists) {
                removeEdge(*it);
            }
        }
    }